

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* generate_list<trng::lagfib4xor<unsigned_int,168u,205u,242u,521u>>
            (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *r1,
            lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *r2,long N,long skip1,long skip2)

{
  long in_RCX;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *in_RDI;
  long in_R8;
  long in_R9;
  long j_1;
  long j;
  long i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v1;
  result_type_conflict in_stack_ffffffffffffff58;
  result_type_conflict in_stack_ffffffffffffff5c;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  long local_88;
  size_type in_stack_ffffffffffffff88;
  long lVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  
  this = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2d341b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2d3425);
  if (0 < in_RCX) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  for (lVar1 = 0; lVar1 < in_RCX; lVar1 = lVar1 + 1) {
    in_stack_ffffffffffffff5c =
         trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::operator()(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
               (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
              );
    in_stack_ffffffffffffff58 =
         trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::operator()(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
               (value_type_conflict4 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
              );
    for (local_88 = 0; local_88 < in_R8; local_88 = local_88 + 1) {
      trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::operator()(this);
    }
    for (in_stack_ffffffffffffff70 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        (long)in_stack_ffffffffffffff70 < in_R9;
        in_stack_ffffffffffffff70 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(in_stack_ffffffffffffff70->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1)) {
      trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::operator()(this);
    }
  }
  std::
  tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ::
  tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
            ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              *)this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2d358b);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff70);
  return (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          *)in_RDI;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}